

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int evp_keyex_init(ptls_key_exchange_algorithm_t *algo,ptls_key_exchange_context_t **_ctx,
                  EVP_PKEY *pkey)

{
  size_t sVar1;
  ptls_key_exchange_context_t **local_60;
  undefined8 local_58;
  undefined8 local_50;
  code *local_48;
  st_evp_keyex_context_t *local_40;
  int local_34;
  st_evp_keyex_context_t *psStack_30;
  int ret;
  st_evp_keyex_context_t *ctx;
  EVP_PKEY *pkey_local;
  ptls_key_exchange_context_t **_ctx_local;
  ptls_key_exchange_algorithm_t *algo_local;
  
  psStack_30 = (st_evp_keyex_context_t *)0x0;
  ctx = (st_evp_keyex_context_t *)pkey;
  pkey_local = (EVP_PKEY *)_ctx;
  _ctx_local = (ptls_key_exchange_context_t **)algo;
  psStack_30 = (st_evp_keyex_context_t *)malloc(0x28);
  if (psStack_30 == (st_evp_keyex_context_t *)0x0) {
    local_34 = 0x201;
  }
  else {
    local_60 = _ctx_local;
    local_58 = 0;
    local_50 = 0;
    local_48 = evp_keyex_on_exchange;
    local_40 = ctx;
    memcpy(psStack_30,&local_60,0x28);
    sVar1 = EVP_PKEY_get1_encoded_public_key(psStack_30->privkey,&(psStack_30->super).pubkey);
    (psStack_30->super).pubkey.len = sVar1;
    if (sVar1 == 0) {
      (psStack_30->super).pubkey.base = (uint8_t *)0x0;
      return 0x201;
    }
    *(st_evp_keyex_context_t **)pkey_local = psStack_30;
    local_34 = 0;
  }
  if ((local_34 != 0) && (psStack_30 != (st_evp_keyex_context_t *)0x0)) {
    evp_keyex_free(psStack_30);
  }
  return local_34;
}

Assistant:

static int evp_keyex_init(ptls_key_exchange_algorithm_t *algo, ptls_key_exchange_context_t **_ctx, EVP_PKEY *pkey)
{
    struct st_evp_keyex_context_t *ctx = NULL;
    int ret;

    /* instantiate */
    if ((ctx = malloc(sizeof(*ctx))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    *ctx = (struct st_evp_keyex_context_t){{algo, {NULL}, evp_keyex_on_exchange}, pkey};

    /* set public key */
    if ((ctx->super.pubkey.len = EVP_PKEY_get1_tls_encodedpoint(ctx->privkey, &ctx->super.pubkey.base)) == 0) {
        ctx->super.pubkey.base = NULL;
        return PTLS_ERROR_NO_MEMORY;
    }

    *_ctx = &ctx->super;
    ret = 0;
Exit:
    if (ret != 0 && ctx != NULL)
        evp_keyex_free(ctx);
    return ret;
}